

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOStream.cpp
# Opt level: O0

void __thiscall Assimp::DefaultIOStream::~DefaultIOStream(DefaultIOStream *this)

{
  DefaultIOStream *this_local;
  
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__DefaultIOStream_01040798;
  if (this->mFile != (FILE *)0x0) {
    fclose((FILE *)this->mFile);
    this->mFile = (FILE *)0x0;
  }
  std::__cxx11::string::~string((string *)&this->mFilename);
  IOStream::~IOStream(&this->super_IOStream);
  return;
}

Assistant:

DefaultIOStream::~DefaultIOStream()
{
    if (mFile) {
        ::fclose(mFile);
        mFile = nullptr;
    }
}